

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_SampleSimple_Test::TestBody(Image_SampleSimple_Test *this)

{
  Allocator AVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  Point2f p;
  Point2f u;
  AssertHelper local_258;
  Float pdf;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  RNG rng;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_208;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> texels;
  PiecewiseConstant2D distrib;
  Image zeroOne;
  undefined1 extraout_var [56];
  
  zeroOne.format = U256;
  zeroOne.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0x3f800000;
  zeroOne.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  zeroOne._12_4_ = 0;
  distrib.domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pstd::pmr::new_delete_resource();
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)&texels,(float *)&zeroOne,
             (float *)&zeroOne.channelNames,(polymorphic_allocator<float> *)&distrib);
  rng.state = (uint64_t)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_208,&texels,(polymorphic_allocator<float> *)&rng);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&distrib,"Y",(allocator<char> *)&gtest_ar);
  channels.n = 1;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&distrib;
  pbrt::Image::Image(&zeroOne,&local_208,(Point2i)0x200000002,channels);
  std::__cxx11::string::~string((string *)&distrib);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_208);
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  u.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  u.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
              ::_M_manager;
  p.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7);
  pbrt::Bounds2<float>::Bounds2((Bounds2<float> *)&gtest_ar,&u,&p);
  AVar1.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::GetSamplingDistribution
            ((Array2D<float> *)&rng,&zeroOne,(function<float_(pbrt::Point2<float>)> *)&local_248,
             (Bounds2f *)&gtest_ar,AVar1);
  AVar1.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D(&distrib,(Array2D<float> *)&rng,AVar1);
  pbrt::Array2D<float>::~Array2D((Array2D<float> *)&rng);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  iVar2 = 1000;
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    fVar5 = pbrt::RNG::Uniform<float>(&rng);
    u.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(&rng);
    u.super_Tuple2<pbrt::Point2,_float>.x = fVar5;
    auVar6._0_8_ = pbrt::PiecewiseConstant2D::Sample(&distrib,&u,&pdf);
    auVar6._8_56_ = extraout_var;
    p.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6._0_16_);
    local_278.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3fe0000000000000;
    testing::internal::CmpHelperGE<float,double>
              ((internal *)&gtest_ar,"p.x","0.5",(float *)&p,(double *)&local_278);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_278);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1f6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_278);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_278.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3fe0000000000000;
    testing::internal::CmpHelperLE<float,double>
              ((internal *)&gtest_ar,"p.y","0.5",&p.super_Tuple2<pbrt::Point2,_float>.y,
               (double *)&local_278);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_278);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x1f7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_278);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D(&distrib);
  pbrt::Image::~Image(&zeroOne);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&texels);
  return;
}

Assistant:

TEST(Image, SampleSimple) {
    pstd::vector<float> texels = {Float(0), Float(1), Float(0), Float(0)};
    Image zeroOne(texels, {2, 2}, {"Y"});
    PiecewiseConstant2D distrib(zeroOne.GetSamplingDistribution());
    RNG rng;
    for (int i = 0; i < 1000; ++i) {
        Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
        Float pdf;
        Point2f p = distrib.Sample(u, &pdf);
        // Due to bilerp on lookup, the non-zero range goes out a bit.
        EXPECT_GE(p.x, 0.5);
        EXPECT_LE(p.y, 0.5);
    }
}